

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

SDL12Key Keysym20to12(SDL_Keycode keysym20)

{
  SDL12Key SVar1;
  
  if (keysym20 < 0x100) {
    return keysym20;
  }
  switch(keysym20) {
  case 0x2c7:
  case 0x3cc:
  case 0x407:
switchD_001143f1_caseD_215a:
    return SDLK12_WORLD_23;
  case 0x2c8:
  case 0x2c9:
  case 0x2ca:
  case 0x2cb:
  case 0x2cc:
  case 0x2cd:
  case 0x2ce:
  case 0x2cf:
  case 0x2d0:
  case 0x2d1:
  case 0x2d2:
  case 0x2d3:
  case 0x2d4:
  case 0x2d5:
  case 0x2d6:
  case 0x2d7:
  case 0x2da:
  case 0x2dc:
  case 0x2de:
  case 0x2df:
  case 0x2e0:
  case 0x2e1:
  case 0x2e2:
  case 0x2e3:
  case 0x2e4:
  case 0x2e5:
  case 0x2e6:
  case 0x2e7:
  case 0x2e8:
  case 0x2e9:
  case 0x2ea:
  case 0x2eb:
  case 0x2ec:
  case 0x2ed:
  case 0x2ee:
  case 0x2ef:
  case 0x2f0:
  case 0x2f1:
  case 0x2f2:
  case 0x2f3:
  case 0x2f4:
  case 0x2f5:
  case 0x2f6:
  case 0x2f7:
  case 0x2f8:
  case 0x2f9:
  case 0x2fa:
  case 0x2fb:
  case 0x2fc:
  case 0x2fd:
  case 0x2fe:
  case 0x2ff:
  case 0x300:
  case 0x301:
  case 0x302:
  case 0x303:
  case 0x304:
  case 0x305:
  case 0x306:
  case 0x307:
  case 0x308:
  case 0x309:
  case 0x30a:
  case 0x30b:
  case 0x30c:
  case 0x30d:
  case 0x30e:
  case 0x30f:
  case 0x310:
  case 0x311:
  case 0x312:
  case 0x313:
  case 0x314:
  case 0x315:
  case 0x316:
  case 0x317:
  case 0x318:
  case 0x319:
  case 0x31a:
  case 0x31b:
  case 0x31c:
  case 0x31d:
  case 0x31e:
  case 799:
  case 800:
  case 0x321:
  case 0x322:
  case 0x323:
  case 0x324:
  case 0x325:
  case 0x326:
  case 0x327:
  case 0x328:
  case 0x329:
  case 0x32a:
  case 0x32b:
  case 0x32c:
  case 0x32d:
  case 0x32e:
  case 0x32f:
  case 0x330:
  case 0x331:
  case 0x332:
  case 0x333:
  case 0x334:
  case 0x335:
  case 0x336:
  case 0x337:
  case 0x338:
  case 0x339:
  case 0x33a:
  case 0x33b:
  case 0x33c:
  case 0x33d:
  case 0x33e:
  case 0x33f:
  case 0x340:
  case 0x341:
  case 0x342:
  case 0x343:
  case 0x344:
  case 0x345:
  case 0x346:
  case 0x347:
  case 0x348:
  case 0x349:
  case 0x34a:
  case 0x34b:
  case 0x34c:
  case 0x34d:
  case 0x34e:
  case 0x34f:
  case 0x350:
  case 0x351:
  case 0x352:
  case 0x353:
  case 0x354:
  case 0x355:
  case 0x356:
  case 0x357:
  case 0x358:
  case 0x359:
  case 0x35a:
  case 0x35b:
  case 0x35c:
  case 0x35d:
  case 0x35e:
  case 0x35f:
  case 0x360:
  case 0x361:
  case 0x362:
  case 0x363:
  case 0x364:
  case 0x365:
  case 0x366:
  case 0x367:
  case 0x368:
  case 0x369:
  case 0x36a:
  case 0x36b:
  case 0x36c:
  case 0x36d:
  case 0x36e:
  case 0x36f:
  case 0x370:
  case 0x371:
  case 0x372:
  case 0x373:
  case 0x374:
  case 0x375:
  case 0x376:
  case 0x377:
  case 0x378:
  case 0x379:
  case 0x37a:
  case 0x37b:
  case 0x37c:
  case 0x37d:
  case 0x37e:
  case 0x37f:
  case 0x380:
  case 0x381:
  case 0x382:
  case 899:
  case 900:
  case 0x387:
  case 0x38b:
  case 0x38d:
  case 0x3a2:
  case 0x3cf:
  case 0x3d0:
  case 0x3d1:
  case 0x3d2:
  case 0x3d3:
  case 0x3d4:
  case 0x3d5:
  case 0x3d6:
  case 0x3d7:
  case 0x3d8:
  case 0x3d9:
  case 0x3da:
  case 0x3db:
  case 0x3dc:
  case 0x3dd:
  case 0x3de:
  case 0x3df:
  case 0x3e0:
  case 0x3e1:
  case 0x3e2:
  case 0x3e3:
  case 0x3e4:
  case 0x3e5:
  case 0x3e6:
  case 999:
  case 1000:
  case 0x3e9:
  case 0x3ea:
  case 0x3eb:
  case 0x3ec:
  case 0x3ed:
  case 0x3ee:
  case 0x3ef:
  case 0x3f0:
  case 0x3f1:
  case 0x3f2:
  case 0x3f3:
  case 0x3f4:
  case 0x3f5:
  case 0x3f6:
  case 0x3f7:
  case 0x3f8:
  case 0x3f9:
  case 0x3fa:
  case 0x3fb:
  case 0x3fc:
  case 0x3fd:
  case 0x3fe:
  case 0x3ff:
  case 0x400:
  case 0x40d:
  case 0x450:
  case 0x45d:
    goto switchD_0011451b_caseD_2262;
  case 0x2d8:
    return SDLK12_WORLD_2;
  case 0x2d9:
  case 0x42a:
    return SDLK12_WORLD_95;
  case 0x2db:
  case 0x403:
switchD_00114399_caseD_30a4:
    return SDLK12_WORLD_18;
  case 0x2dd:
    return SDLK12_WORLD_29;
  case 0x385:
    goto switchD_00114407_caseD_23a0;
  case 0x386:
  case 0x452:
switchD_0011436d_caseD_e01:
    return SDLK12_WORLD_1;
  case 0x388:
  case 0x453:
switchD_001143c5_caseD_2002:
    return SDLK12_WORLD_2;
  case 0x389:
  case 0x451:
    return SDLK12_WORLD_3;
  case 0x38a:
switchD_001143c5_caseD_2005:
    return SDLK12_WORLD_4;
  case 0x38c:
    goto switchD_00114407_caseD_23a1;
  case 0x38e:
    goto switchD_00114407_caseD_23a3;
  case 0x38f:
switchD_00114407_caseD_239b:
    return SDLK12_WORLD_11;
  case 0x390:
switchD_001143f1_caseD_2159:
    return SDLK12_WORLD_22;
  case 0x391:
switchD_0011441d_caseD_221d:
    return SDLK12_WORLD_33;
  case 0x392:
  case 0x431:
switchD_0011441d_caseD_221e:
    return SDLK12_WORLD_34;
  case 0x393:
  case 0x446:
    goto switchD_001143f1_caseD_215b;
  case 0x394:
switchD_001143f1_caseD_215c:
    return SDLK12_WORLD_36;
  case 0x395:
  case 0x435:
switchD_001143f1_caseD_215d:
    return SDLK12_WORLD_37;
  case 0x396:
switchD_001143f1_caseD_215e:
    return SDLK12_WORLD_38;
  case 0x397:
  case 0x433:
    goto switchD_00114383_caseD_627;
  case 0x398:
switchD_0011436d_caseD_e28:
    return SDLK12_WORLD_40;
  case 0x399:
  case 0x438:
switchD_00114383_caseD_629:
    return SDLK12_WORLD_41;
  case 0x39a:
switchD_0011436d_caseD_e2a:
    return SDLK12_WORLD_42;
  case 0x39b:
switchD_00114399_caseD_30d2:
    return SDLK12_WORLD_43;
  case 0x39c:
  case 0x43b:
switchD_001143db_caseD_25c1:
    return SDLK12_WORLD_44;
  case 0x39d:
  case 0x43c:
switchD_001143db_caseD_25b7:
    return SDLK12_WORLD_45;
  case 0x39e:
  case 0x43d:
switchD_001143db_caseD_25cb:
    return SDLK12_WORLD_46;
  case 0x39f:
  case 0x43e:
switchD_0011451b_caseD_2261:
    return SDLK12_WORLD_47;
  case 0x3a0:
  case 0x43f:
switchD_001143c5_caseD_2018:
    return SDLK12_WORLD_48;
  case 0x3a1:
  case 0x44f:
switchD_001143c5_caseD_2019:
    return SDLK12_WORLD_49;
  case 0x3a3:
  case 0x440:
switchD_001143c5_caseD_201c:
    return SDLK12_WORLD_50;
  case 0x3a4:
switchD_0011436d_caseD_e34:
    return SDLK12_WORLD_52;
  case 0x3a5:
    return SDLK12_WORLD_53;
  case 0x3a6:
switchD_0011441d_caseD_221a:
    return SDLK12_WORLD_54;
  case 0x3a7:
switchD_00114399_caseD_30e9:
    return SDLK12_WORLD_55;
  case 0x3a8:
    return SDLK12_WORLD_56;
  case 0x3a9:
  case 1099:
    goto switchD_00114383_caseD_639;
  case 0x3aa:
switchD_001143c5_caseD_2007:
    return SDLK12_WORLD_5;
  case 0x3ab:
switchD_00114407_caseD_23a4:
    return SDLK12_WORLD_9;
  case 0x3ac:
switchD_001143f1_caseD_2154:
    return SDLK12_WORLD_17;
  case 0x3ad:
switchD_001143f1_caseD_2155:
    return SDLK12_WORLD_18;
  case 0x3ae:
switchD_001143f1_caseD_2156:
    return SDLK12_WORLD_19;
  case 0x3af:
  case 0x404:
switchD_001143f1_caseD_2157:
    return SDLK12_WORLD_20;
  case 0x3b0:
  case 0x40a:
    return SDLK12_WORLD_26;
  case 0x3b1:
    return SDLK12_WORLD_65;
  case 0x3b2:
    return SDLK12_WORLD_66;
  case 0x3b3:
switchD_00114357_caseD_103:
    return SDLK12_WORLD_67;
  case 0x3b4:
    return SDLK12_WORLD_68;
  case 0x3b5:
    return SDLK12_WORLD_69;
  case 0x3b6:
    return SDLK12_WORLD_70;
  case 0x3b7:
    return SDLK12_WORLD_71;
  case 0x3b8:
    return SDLK12_WORLD_72;
  case 0x3b9:
    return SDLK12_WORLD_73;
  case 0x3ba:
    return SDLK12_WORLD_74;
  case 0x3bb:
    return SDLK12_WORLD_75;
  case 0x3bc:
    return SDLK12_WORLD_76;
  case 0x3bd:
    return SDLK12_WORLD_77;
  case 0x3be:
    return SDLK12_WORLD_78;
  case 0x3bf:
    return SDLK12_WORLD_79;
  case 0x3c0:
switchD_00114357_caseD_111:
    return SDLK12_WORLD_80;
  case 0x3c1:
    return SDLK12_WORLD_81;
  case 0x3c2:
  case 0x421:
    return SDLK12_WORLD_83;
  case 0x3c3:
    return SDLK12_WORLD_82;
  case 0x3c4:
    return SDLK12_WORLD_84;
  case 0x3c5:
  case 0x423:
    return SDLK12_WORLD_85;
  case 0x3c6:
switchD_00114383_caseD_5e6:
    return SDLK12_WORLD_86;
  case 0x3c7:
    return SDLK12_WORLD_87;
  case 0x3c8:
  case 0x42c:
    return SDLK12_WORLD_88;
  case 0x3c9:
switchD_0011436d_caseD_e59:
    return SDLK12_WORLD_89;
  case 0x3ca:
switchD_001143f1_caseD_2158:
    return SDLK12_WORLD_21;
  case 0x3cb:
  case 0x409:
    return SDLK12_WORLD_25;
  case 0x3cd:
switchD_0011436d_caseD_e18:
    return SDLK12_WORLD_24;
  case 0x3ce:
  case 0x40b:
switchD_001143c5_caseD_2012:
    return SDLK12_WORLD_27;
  case 0x401:
    return SDLK12_WORLD_19;
  case 0x402:
switchD_0011436d_caseD_e11:
    return SDLK12_WORLD_17;
  case 0x405:
    return SDLK12_WORLD_21;
  case 0x406:
    return SDLK12_WORLD_22;
  case 0x408:
switchD_00114399_caseD_30af:
    return SDLK12_WORLD_24;
  case 0x40c:
switchD_0011436d_caseD_e1c:
    return SDLK12_WORLD_28;
  case 0x40e:
switchD_00114399_caseD_30bb:
    return SDLK12_WORLD_30;
  case 0x40f:
switchD_00114399_caseD_30bd:
    return SDLK12_WORLD_31;
  case 0x410:
    goto switchD_001143db_caseD_25ab;
  case 0x411:
    goto switchD_001143db_caseD_25ad;
  case 0x412:
    return SDLK12_WORLD_87;
  case 0x413:
    goto switchD_001143db_caseD_25aa;
  case 0x414:
    goto switchD_001143db_caseD_25bd;
  case 0x415:
switchD_00114383_caseD_5d5:
    return SDLK12_WORLD_69;
  case 0x416:
    return SDLK12_WORLD_86;
  case 0x417:
    return SDLK12_WORLD_90;
  case 0x418:
switchD_00114383_caseD_649:
    return SDLK12_WORLD_73;
  case 0x419:
    goto switchD_00114383_caseD_5da;
  case 0x41a:
    goto switchD_00114383_caseD_5db;
  case 0x41b:
switchD_00114383_caseD_5dc:
    return SDLK12_WORLD_76;
  case 0x41c:
switchD_00114383_caseD_64d:
    return SDLK12_WORLD_77;
  case 0x41d:
switchD_00114383_caseD_64e:
    return SDLK12_WORLD_78;
  case 0x41e:
switchD_00114383_caseD_64f:
    return SDLK12_WORLD_79;
  case 0x41f:
    goto switchD_00114383_caseD_5e0;
  case 0x420:
switchD_001143c5_caseD_2021:
    return SDLK12_WORLD_82;
  case 0x422:
    return SDLK12_WORLD_84;
  case 0x424:
switchD_001143c5_caseD_2022:
    return SDLK12_WORLD_70;
  case 0x425:
switchD_00114383_caseD_648:
    return SDLK12_WORLD_72;
  case 0x426:
    goto switchD_001143db_caseD_25b3;
  case 0x427:
switchD_001145a3_caseD_2193:
    return SDLK12_WORLD_94;
  case 0x428:
    return SDLK12_WORLD_91;
  case 0x429:
switchD_001145a3_caseD_2192:
    return SDLK12_WORLD_93;
  case 0x42b:
    return SDLK12_WORLD_89;
  case 0x42d:
switchD_001145a3_caseD_2191:
    return SDLK12_WORLD_92;
  case 0x42e:
switchD_00114383_caseD_5d0:
    return SDLK12_WORLD_64;
  case 0x42f:
switchD_00114383_caseD_651:
    return SDLK12_WORLD_81;
  case 0x430:
    goto switchD_00114383_caseD_621;
  case 0x432:
switchD_00114383_caseD_637:
    return SDLK12_WORLD_55;
  case 0x434:
switchD_00114383_caseD_624:
    return SDLK12_WORLD_36;
  case 0x436:
switchD_00114383_caseD_636:
    return SDLK12_WORLD_54;
  case 0x437:
    goto switchD_00114383_caseD_63a;
  case 0x439:
switchD_00114399_caseD_30cf:
    return SDLK12_WORLD_42;
  case 0x43a:
switchD_00114383_caseD_62b:
    return SDLK12_WORLD_43;
  case 0x441:
switchD_00114399_caseD_30e2:
    return SDLK12_WORLD_51;
  case 0x442:
switchD_00114383_caseD_634:
    return SDLK12_WORLD_52;
  case 0x443:
switchD_00114383_caseD_635:
    return SDLK12_WORLD_53;
  case 0x444:
switchD_00114399_caseD_30cb:
    return SDLK12_WORLD_38;
  case 0x445:
switchD_00114399_caseD_30cd:
    return SDLK12_WORLD_40;
  case 0x447:
switchD_00114399_caseD_309b:
    return SDLK12_WORLD_62;
  case 0x448:
    return SDLK12_WORLD_59;
  case 0x449:
    goto switchD_0011441d_caseD_222a;
  case 0x44a:
switchD_0011441d_caseD_2228:
    return SDLK12_WORLD_63;
  case 0x44c:
switchD_00114399_caseD_30ea:
    return SDLK12_WORLD_56;
  case 0x44d:
    goto switchD_0011441d_caseD_2229;
  case 0x44e:
    return SDLK12_WORLD_32;
  case 0x454:
    return SDLK12_WORLD_4;
  case 0x455:
    return SDLK12_WORLD_5;
  case 0x456:
    return SDLK12_WORLD_6;
  case 0x457:
switchD_00114399_caseD_30a1:
    return SDLK12_WORLD_7;
  case 0x458:
switchD_00114399_caseD_30a3:
    return SDLK12_WORLD_8;
  case 0x459:
    return SDLK12_WORLD_9;
  case 0x45a:
    return SDLK12_WORLD_10;
  case 0x45b:
    return SDLK12_WORLD_11;
  case 0x45c:
switchD_00114399_caseD_30e3:
    return SDLK12_WORLD_12;
  case 0x45e:
switchD_00114399_caseD_30e7:
    return SDLK12_WORLD_14;
  case 0x45f:
switchD_00114399_caseD_30c3:
    return SDLK12_WORLD_15;
  default:
    switch(keysym20) {
    case 0x100:
    case 0x154:
switchD_00114399_caseD_30bf:
      return SDLK12_WORLD_32;
    case 0x101:
    case 0x155:
      goto switchD_00114383_caseD_5d0;
    case 0x102:
switchD_00114399_caseD_30c6:
      return SDLK12_WORLD_35;
    case 0x103:
      goto switchD_00114357_caseD_103;
    case 0x104:
    case 0x126:
switchD_001143c5_caseD_2003:
      return SDLK12_WORLD_1;
    case 0x105:
      goto switchD_0011436d_caseD_e11;
    case 0x106:
    case 0x108:
      goto switchD_00114399_caseD_30cb;
    case 0x107:
    case 0x109:
      goto switchD_001143c5_caseD_2022;
    case 0x10a:
    case 0x139:
      goto switchD_001143f1_caseD_215d;
    case 0x10b:
    case 0x13a:
      goto switchD_00114383_caseD_5d5;
    case 0x10c:
      goto switchD_00114399_caseD_30cd;
    case 0x10d:
      goto switchD_00114383_caseD_648;
    case 0x10e:
    case 0x12a:
      goto switchD_0011451b_caseD_2261;
    case 0x10f:
    case 299:
      goto switchD_00114383_caseD_64f;
    case 0x110:
      goto switchD_001143c5_caseD_2018;
    case 0x111:
      goto switchD_00114357_caseD_111;
    case 0x112:
      goto switchD_00114407_caseD_23a6;
    case 0x113:
switchD_00114399_caseD_30b3:
      return SDLK12_WORLD_26;
    case 0x114:
    case 0x115:
    case 300:
    case 0x12d:
    case 0x132:
    case 0x133:
    case 0x13f:
    case 0x140:
    case 0x149:
    case 0x14e:
    case 0x14f:
    case 0x152:
    case 0x153:
    case 0x174:
    case 0x175:
    case 0x176:
    case 0x177:
    case 0x178:
    case 0x17f:
    case 0x180:
    case 0x181:
    case 0x182:
    case 0x183:
    case 0x184:
    case 0x185:
    case 0x186:
    case 0x187:
    case 0x188:
    case 0x189:
    case 0x18a:
    case 0x18b:
    case 0x18c:
    case 0x18d:
    case 0x18e:
    case 399:
    case 400:
    case 0x191:
      goto switchD_0011451b_caseD_2262;
    case 0x116:
    case 0x11a:
      goto switchD_001143db_caseD_25c1;
    case 0x117:
    case 0x11b:
      goto switchD_00114383_caseD_5dc;
    case 0x118:
      goto switchD_00114399_caseD_30cf;
    case 0x119:
      return SDLK12_WORLD_74;
    case 0x11c:
    case 0x158:
      goto switchD_00114399_caseD_30ea;
    case 0x11d:
    case 0x159:
switchD_00114383_caseD_5e8:
      return SDLK12_WORLD_88;
    case 0x11e:
    case 0x122:
      goto switchD_00114407_caseD_239b;
    case 0x11f:
    case 0x123:
      goto switchD_001143c5_caseD_2012;
    case 0x120:
    case 0x150:
switchD_001143c5_caseD_2030:
      return SDLK12_WORLD_53;
    case 0x121:
    case 0x151:
switchD_00114383_caseD_5e5:
      return SDLK12_WORLD_85;
    case 0x124:
    case 0x13b:
switchD_00114399_caseD_30f2:
      return SDLK12_WORLD_6;
    case 0x125:
    case 0x13c:
switchD_00114399_caseD_30ab:
      return SDLK12_WORLD_22;
    case 0x127:
      goto switchD_001143f1_caseD_2154;
    case 0x128:
      goto switchD_001143c5_caseD_2007;
    case 0x129:
switchD_00114399_caseD_30aa:
      return SDLK12_WORLD_21;
    case 0x12e:
switchD_00114399_caseD_30cc:
      return SDLK12_WORLD_39;
    case 0x12f:
      return SDLK12_WORLD_71;
    case 0x130:
      goto switchD_00114407_caseD_23a4;
    case 0x131:
switchD_00114399_caseD_30b1:
      return SDLK12_WORLD_25;
    case 0x134:
    case 0x166:
      goto switchD_00114399_caseD_30e3;
    case 0x135:
    case 0x167:
switchD_0011451b_caseD_2264:
      return SDLK12_WORLD_28;
    case 0x136:
      goto switchD_00114399_caseD_30e2;
    case 0x137:
      return SDLK12_WORLD_83;
    case 0x138:
switchD_0011436d_caseD_e02:
      return SDLK12_WORLD_2;
    case 0x13d:
switchD_0011436d_caseD_e05:
      return SDLK12_WORLD_5;
    case 0x13e:
      goto switchD_001143f1_caseD_2158;
    case 0x141:
    case 0x156:
switchD_001143c5_caseD_2004:
      return SDLK12_WORLD_3;
    case 0x142:
      goto switchD_001143f1_caseD_2156;
    case 0x143:
    case 0x145:
      goto switchD_001143c5_caseD_2019;
    case 0x144:
    case 0x146:
switchD_001143c5_caseD_2020:
      return SDLK12_WORLD_81;
    case 0x147:
    case 0x14c:
      goto switchD_001143c5_caseD_201c;
    case 0x148:
    case 0x14d:
      goto switchD_001143c5_caseD_2021;
    case 0x14a:
switchD_0011451b_caseD_2260:
      return SDLK12_WORLD_29;
    case 0x14b:
      goto switchD_00114399_caseD_30bd;
    case 0x157:
switchD_00114399_caseD_30a6:
      return SDLK12_WORLD_19;
    case 0x15a:
switchD_001143c5_caseD_2008:
      return SDLK12_WORLD_6;
    case 0x15b:
      goto switchD_001143f1_caseD_2159;
    case 0x15c:
    case 0x162:
    case 0x16a:
      goto switchD_00114399_caseD_309b;
    case 0x15d:
    case 0x163:
    case 0x16b:
      return SDLK12_WORLD_94;
    case 0x15e:
switchD_0011436d_caseD_e0a:
      return SDLK12_WORLD_10;
    case 0x15f:
switchD_0011436d_caseD_e1a:
      return SDLK12_WORLD_26;
    case 0x160:
switchD_0011436d_caseD_e09:
      return SDLK12_WORLD_9;
    case 0x161:
switchD_0011436d_caseD_e19:
      return SDLK12_WORLD_25;
    case 0x164:
switchD_0011436d_caseD_e0b:
      return SDLK12_WORLD_11;
    case 0x165:
switchD_0011436d_caseD_e1b:
      return SDLK12_WORLD_27;
    case 0x168:
    case 0x16c:
      return SDLK12_WORLD_61;
    case 0x169:
    case 0x16d:
      return SDLK12_WORLD_93;
    case 0x16e:
    case 0x172:
switchD_00114399_caseD_30eb:
      return SDLK12_WORLD_57;
    case 0x16f:
    case 0x173:
      goto switchD_0011436d_caseD_e59;
    case 0x170:
switchD_00114399_caseD_30ed:
      return SDLK12_WORLD_59;
    case 0x171:
      return SDLK12_WORLD_91;
    case 0x179:
switchD_00114407_caseD_239d:
      return SDLK12_WORLD_12;
    case 0x17a:
      goto switchD_0011436d_caseD_e1c;
    case 0x17b:
switchD_0011436d_caseD_e0f:
      return SDLK12_WORLD_15;
    case 0x17c:
switchD_0011441d_caseD_222b:
      return SDLK12_WORLD_31;
    case 0x17d:
switchD_0011436d_caseD_e0e:
      return SDLK12_WORLD_14;
    case 0x17e:
switchD_0011436d_caseD_e1e:
      return SDLK12_WORLD_30;
    case 0x192:
      goto switchD_00114383_caseD_5e6;
    default:
      switch(keysym20) {
      case 0xe01:
        goto switchD_0011436d_caseD_e01;
      case 0xe02:
        goto switchD_0011436d_caseD_e02;
      case 0xe03:
        goto switchD_001143c5_caseD_2004;
      case 0xe04:
        return SDLK12_WORLD_4;
      case 0xe05:
        goto switchD_0011436d_caseD_e05;
      case 0xe06:
        goto switchD_001143c5_caseD_2008;
      case 0xe07:
        return SDLK12_WORLD_7;
      case 0xe08:
        return SDLK12_WORLD_8;
      case 0xe09:
        goto switchD_0011436d_caseD_e09;
      case 0xe0a:
        goto switchD_0011436d_caseD_e0a;
      case 0xe0b:
        goto switchD_0011436d_caseD_e0b;
      case 0xe0c:
        goto switchD_00114407_caseD_239d;
      case 0xe0d:
switchD_00114407_caseD_239e:
        return SDLK12_WORLD_13;
      case 0xe0e:
        goto switchD_0011436d_caseD_e0e;
      case 0xe0f:
        goto switchD_0011436d_caseD_e0f;
      case 0xe10:
        return SDLK12_WORLD_16;
      case 0xe11:
        goto switchD_0011436d_caseD_e11;
      case 0xe12:
        goto switchD_001143f1_caseD_2155;
      case 0xe13:
        goto switchD_001143f1_caseD_2156;
      case 0xe14:
        goto switchD_001143f1_caseD_2157;
      case 0xe15:
        goto switchD_001143f1_caseD_2158;
      case 0xe16:
        goto switchD_001143f1_caseD_2159;
      case 0xe17:
        goto switchD_001143f1_caseD_215a;
      case 0xe18:
        goto switchD_0011436d_caseD_e18;
      case 0xe19:
        goto switchD_0011436d_caseD_e19;
      case 0xe1a:
        goto switchD_0011436d_caseD_e1a;
      case 0xe1b:
        goto switchD_0011436d_caseD_e1b;
      case 0xe1c:
        goto switchD_0011436d_caseD_e1c;
      case 0xe1d:
        return SDLK12_WORLD_29;
      case 0xe1e:
        goto switchD_0011436d_caseD_e1e;
      case 0xe1f:
        goto switchD_0011441d_caseD_222b;
      case 0xe20:
        return SDLK12_WORLD_32;
      case 0xe21:
switchD_00114383_caseD_621:
        return SDLK12_WORLD_33;
      case 0xe22:
        return SDLK12_WORLD_34;
      case 0xe23:
switchD_001143f1_caseD_215b:
        return SDLK12_WORLD_35;
      case 0xe24:
        goto switchD_001143f1_caseD_215c;
      case 0xe25:
        return SDLK12_WORLD_37;
      case 0xe26:
        goto switchD_001143f1_caseD_215e;
      case 0xe27:
switchD_00114383_caseD_627:
        return SDLK12_WORLD_39;
      case 0xe28:
        goto switchD_0011436d_caseD_e28;
      case 0xe29:
        return SDLK12_WORLD_41;
      case 0xe2a:
        goto switchD_0011436d_caseD_e2a;
      case 0xe2b:
        return SDLK12_WORLD_43;
      case 0xe2c:
        return SDLK12_WORLD_44;
      case 0xe2d:
        return SDLK12_WORLD_45;
      case 0xe2e:
        return SDLK12_WORLD_46;
      case 0xe2f:
        return SDLK12_WORLD_47;
      case 0xe30:
        return SDLK12_WORLD_48;
      case 0xe31:
        return SDLK12_WORLD_49;
      case 0xe32:
        return SDLK12_WORLD_50;
      case 0xe33:
switchD_001143c5_caseD_201d:
        return SDLK12_WORLD_51;
      case 0xe34:
        goto switchD_0011436d_caseD_e34;
      case 0xe35:
        goto switchD_001143c5_caseD_2030;
      case 0xe36:
        goto switchD_0011441d_caseD_221a;
      case 0xe37:
switchD_001143c5_caseD_2033:
        return SDLK12_WORLD_55;
      case 0xe38:
        return SDLK12_WORLD_56;
      case 0xe39:
switchD_00114383_caseD_639:
        return SDLK12_WORLD_57;
      case 0xe3a:
switchD_00114383_caseD_63a:
        return SDLK12_WORLD_58;
      case 0xe3b:
      case 0xe3c:
      case 0xe3d:
      case 0xe3e:
      case 0xe4e:
      case 0xe4f:
        goto switchD_0011451b_caseD_2262;
      case 0xe3f:
        goto switchD_001143db_caseD_25ae;
      case 0xe40:
        goto switchD_00114383_caseD_5d0;
      case 0xe41:
switchD_001143db_caseD_25ab:
        return SDLK12_WORLD_65;
      case 0xe42:
switchD_001143db_caseD_25ad:
        return SDLK12_WORLD_66;
      case 0xe43:
switchD_001143db_caseD_25b3:
        return SDLK12_WORLD_67;
      case 0xe44:
switchD_001143db_caseD_25bd:
        return SDLK12_WORLD_68;
      case 0xe45:
        goto switchD_00114383_caseD_5d5;
      case 0xe46:
        goto switchD_001143c5_caseD_2022;
      case 0xe47:
switchD_001143db_caseD_25aa:
        return SDLK12_WORLD_71;
      case 0xe48:
switchD_001143db_caseD_25b2:
        return SDLK12_WORLD_72;
      case 0xe49:
switchD_001143db_caseD_25bc:
        return SDLK12_WORLD_73;
      case 0xe4a:
switchD_00114383_caseD_5da:
        return SDLK12_WORLD_74;
      case 0xe4b:
switchD_00114383_caseD_5db:
        return SDLK12_WORLD_75;
      case 0xe4c:
        goto switchD_00114383_caseD_5dc;
      case 0xe4d:
switchD_00114383_caseD_5dd:
        return SDLK12_WORLD_77;
      case 0xe50:
switchD_00114383_caseD_5e0:
        return SDLK12_WORLD_80;
      case 0xe51:
        goto switchD_001143c5_caseD_2020;
      case 0xe52:
        goto switchD_001143c5_caseD_2021;
      case 0xe53:
switchD_00114383_caseD_5e3:
        return SDLK12_WORLD_83;
      case 0xe54:
switchD_00114383_caseD_5e4:
        return SDLK12_WORLD_84;
      case 0xe55:
        goto switchD_00114383_caseD_5e5;
      case 0xe56:
        goto switchD_00114383_caseD_5e6;
      case 0xe57:
switchD_00114383_caseD_5e7:
        return SDLK12_WORLD_87;
      case 0xe58:
        goto switchD_00114383_caseD_5e8;
      case 0xe59:
        goto switchD_0011436d_caseD_e59;
      default:
        switch(keysym20) {
        case 0x5d0:
        case 0x640:
          goto switchD_00114383_caseD_5d0;
        case 0x5d1:
        case 0x641:
          goto switchD_001143db_caseD_25ab;
        case 0x5d2:
        case 0x642:
          goto switchD_001143db_caseD_25ad;
        case 0x5d3:
        case 0x643:
          goto switchD_001143db_caseD_25b3;
        case 0x5d4:
        case 0x644:
          goto switchD_001143db_caseD_25bd;
        case 0x5d5:
        case 0x645:
          goto switchD_00114383_caseD_5d5;
        case 0x5d6:
        case 0x646:
          goto switchD_001143c5_caseD_2022;
        case 0x5d7:
        case 0x647:
          goto switchD_001143db_caseD_25aa;
        case 0x5d8:
          goto switchD_001143db_caseD_25b2;
        case 0x5d9:
          goto switchD_001143db_caseD_25bc;
        case 0x5da:
        case 0x64a:
          goto switchD_00114383_caseD_5da;
        case 0x5db:
        case 0x64b:
          goto switchD_00114383_caseD_5db;
        case 0x5dc:
        case 0x64c:
          goto switchD_00114383_caseD_5dc;
        case 0x5dd:
          goto switchD_00114383_caseD_5dd;
        case 0x5de:
          return SDLK12_WORLD_78;
        case 0x5df:
          return SDLK12_WORLD_79;
        case 0x5e0:
        case 0x650:
          goto switchD_00114383_caseD_5e0;
        case 0x5e1:
          goto switchD_001143c5_caseD_2020;
        case 0x5e2:
        case 0x652:
          goto switchD_001143c5_caseD_2021;
        case 0x5e3:
          goto switchD_00114383_caseD_5e3;
        case 0x5e4:
          goto switchD_00114383_caseD_5e4;
        case 0x5e5:
          goto switchD_00114383_caseD_5e5;
        case 0x5e6:
          goto switchD_00114383_caseD_5e6;
        case 0x5e7:
          goto switchD_00114383_caseD_5e7;
        case 0x5e8:
          goto switchD_00114383_caseD_5e8;
        case 0x5e9:
          return SDLK12_WORLD_89;
        case 0x5ea:
          return SDLK12_WORLD_90;
        case 0x5eb:
        case 0x5ec:
        case 0x5ed:
        case 0x5ee:
        case 0x5ef:
        case 0x5f0:
        case 0x5f1:
        case 0x5f2:
        case 0x5f3:
        case 0x5f4:
        case 0x5f5:
        case 0x5f6:
        case 0x5f7:
        case 0x5f8:
        case 0x5f9:
        case 0x5fa:
        case 0x5fb:
        case 0x5fc:
        case 0x5fd:
        case 0x5fe:
        case 0x5ff:
        case 0x600:
        case 0x601:
        case 0x602:
        case 0x603:
        case 0x604:
        case 0x605:
        case 0x606:
        case 0x607:
        case 0x608:
        case 0x609:
        case 0x60a:
        case 0x60b:
        case 0x60d:
        case 0x60e:
        case 0x60f:
        case 0x610:
        case 0x611:
        case 0x612:
        case 0x613:
        case 0x614:
        case 0x615:
        case 0x616:
        case 0x617:
        case 0x618:
        case 0x619:
        case 0x61a:
        case 0x61c:
        case 0x61d:
        case 0x61e:
        case 0x620:
        case 0x63b:
        case 0x63c:
        case 0x63d:
        case 0x63e:
        case 0x63f:
          goto switchD_0011451b_caseD_2262;
        case 0x60c:
          goto switchD_00114399_caseD_30e3;
        case 0x61b:
          goto switchD_001143c5_caseD_2012;
        case 0x61f:
          goto switchD_00114399_caseD_30bd;
        case 0x621:
          goto switchD_00114383_caseD_621;
        case 0x622:
          goto switchD_0011441d_caseD_221e;
        case 0x623:
          goto switchD_001143f1_caseD_215b;
        case 0x624:
          goto switchD_00114383_caseD_624;
        case 0x625:
          goto switchD_001143f1_caseD_215d;
        case 0x626:
          goto switchD_00114399_caseD_30cb;
        case 0x627:
          goto switchD_00114383_caseD_627;
        case 0x628:
          goto switchD_00114399_caseD_30cd;
        case 0x629:
          goto switchD_00114383_caseD_629;
        case 0x62a:
          goto switchD_00114399_caseD_30cf;
        case 0x62b:
          goto switchD_00114383_caseD_62b;
        case 0x62c:
          goto switchD_001143db_caseD_25c1;
        case 0x62d:
          goto switchD_001143db_caseD_25b7;
        case 0x62e:
          goto switchD_001143db_caseD_25cb;
        case 0x62f:
          goto switchD_0011451b_caseD_2261;
        case 0x630:
          goto switchD_001143c5_caseD_2018;
        case 0x631:
          goto switchD_001143c5_caseD_2019;
        case 0x632:
          goto switchD_001143c5_caseD_201c;
        case 0x633:
          goto switchD_00114399_caseD_30e2;
        case 0x634:
          goto switchD_00114383_caseD_634;
        case 0x635:
          goto switchD_00114383_caseD_635;
        case 0x636:
          goto switchD_00114383_caseD_636;
        case 0x637:
          goto switchD_00114383_caseD_637;
        case 0x638:
          goto switchD_00114399_caseD_30ea;
        case 0x639:
          goto switchD_00114383_caseD_639;
        case 0x63a:
          goto switchD_00114383_caseD_63a;
        case 0x648:
          goto switchD_00114383_caseD_648;
        case 0x649:
          goto switchD_00114383_caseD_649;
        case 0x64d:
          goto switchD_00114383_caseD_64d;
        case 0x64e:
          goto switchD_00114383_caseD_64e;
        case 0x64f:
          goto switchD_00114383_caseD_64f;
        case 0x651:
          goto switchD_00114383_caseD_651;
        default:
          switch(keysym20) {
          case 0x309b:
            goto switchD_00114399_caseD_309b;
          case 0x309c:
            goto switchD_0011441d_caseD_2228;
          case 0x309d:
          case 0x309e:
          case 0x309f:
          case 0x30a0:
          case 0x30ac:
          case 0x30ae:
          case 0x30b0:
          case 0x30b2:
          case 0x30b4:
          case 0x30b6:
          case 0x30b8:
          case 0x30ba:
          case 0x30bc:
          case 0x30be:
          case 0x30c0:
          case 0x30c2:
          case 0x30c5:
          case 0x30c7:
          case 0x30c9:
          case 0x30d0:
          case 0x30d1:
          case 0x30d3:
          case 0x30d4:
          case 0x30d6:
          case 0x30d7:
          case 0x30d9:
          case 0x30da:
          case 0x30dc:
          case 0x30dd:
          case 0x30ee:
          case 0x30f0:
          case 0x30f1:
          case 0x30f4:
          case 0x30f5:
          case 0x30f6:
          case 0x30f7:
          case 0x30f8:
          case 0x30f9:
          case 0x30fa:
            goto switchD_0011451b_caseD_2262;
          case 0x30a1:
            goto switchD_00114399_caseD_30a1;
          case 0x30a2:
            goto switchD_001143f1_caseD_2154;
          case 0x30a3:
            goto switchD_00114399_caseD_30a3;
          case 0x30a4:
            goto switchD_00114399_caseD_30a4;
          case 0x30a5:
            goto switchD_00114407_caseD_23a4;
          case 0x30a6:
            goto switchD_00114399_caseD_30a6;
          case 0x30a7:
switchD_00114407_caseD_23a6:
            return SDLK12_WORLD_10;
          case 0x30a8:
            return SDLK12_WORLD_20;
          case 0x30a9:
            goto switchD_00114407_caseD_239b;
          case 0x30aa:
            goto switchD_00114399_caseD_30aa;
          case 0x30ab:
            goto switchD_00114399_caseD_30ab;
          case 0x30ad:
            return SDLK12_WORLD_23;
          case 0x30af:
            goto switchD_00114399_caseD_30af;
          case 0x30b1:
            goto switchD_00114399_caseD_30b1;
          case 0x30b3:
            goto switchD_00114399_caseD_30b3;
          case 0x30b5:
            goto switchD_001143c5_caseD_2012;
          case 0x30b7:
            goto switchD_0011451b_caseD_2264;
          case 0x30b9:
            goto switchD_0011451b_caseD_2260;
          case 0x30bb:
            goto switchD_00114399_caseD_30bb;
          case 0x30bd:
            goto switchD_00114399_caseD_30bd;
          case 0x30bf:
            goto switchD_00114399_caseD_30bf;
          case 0x30c1:
            return SDLK12_WORLD_33;
          case 0x30c3:
            goto switchD_00114399_caseD_30c3;
          case 0x30c4:
            return SDLK12_WORLD_34;
          case 0x30c6:
            goto switchD_00114399_caseD_30c6;
          case 0x30c8:
            return SDLK12_WORLD_36;
          case 0x30ca:
            goto switchD_001143f1_caseD_215d;
          case 0x30cb:
            goto switchD_00114399_caseD_30cb;
          case 0x30cc:
            goto switchD_00114399_caseD_30cc;
          case 0x30cd:
            goto switchD_00114399_caseD_30cd;
          case 0x30ce:
            return SDLK12_WORLD_41;
          case 0x30cf:
            goto switchD_00114399_caseD_30cf;
          case 0x30d2:
            goto switchD_00114399_caseD_30d2;
          case 0x30d5:
            goto switchD_001143db_caseD_25c1;
          case 0x30d8:
            return SDLK12_WORLD_45;
          case 0x30db:
            return SDLK12_WORLD_46;
          case 0x30de:
            goto switchD_0011451b_caseD_2261;
          case 0x30df:
            goto switchD_001143c5_caseD_2018;
          case 0x30e0:
            goto switchD_001143c5_caseD_2019;
          case 0x30e1:
            goto switchD_001143c5_caseD_201c;
          case 0x30e2:
            goto switchD_00114399_caseD_30e2;
          case 0x30e3:
            goto switchD_00114399_caseD_30e3;
          case 0x30e4:
            return SDLK12_WORLD_52;
          case 0x30e5:
            return SDLK12_WORLD_13;
          case 0x30e6:
            goto switchD_001143c5_caseD_2030;
          case 0x30e7:
            goto switchD_00114399_caseD_30e7;
          case 0x30e8:
            return SDLK12_WORLD_54;
          case 0x30e9:
            goto switchD_00114399_caseD_30e9;
          case 0x30ea:
            goto switchD_00114399_caseD_30ea;
          case 0x30eb:
            goto switchD_00114399_caseD_30eb;
          case 0x30ec:
            return SDLK12_WORLD_58;
          case 0x30ed:
            goto switchD_00114399_caseD_30ed;
          case 0x30ef:
switchD_0011441d_caseD_2229:
            return SDLK12_WORLD_60;
          case 0x30f2:
            goto switchD_00114399_caseD_30f2;
          case 0x30f3:
switchD_0011441d_caseD_222a:
            return SDLK12_WORLD_61;
          case 0x30fb:
            goto switchD_001143c5_caseD_2007;
          case 0x30fc:
            return SDLK12_WORLD_16;
          }
        }
      }
    }
  }
  switch(keysym20) {
  case 0x40000039:
    return SDLK12_CAPSLOCK;
  case 0x4000003a:
    return SDLK12_F1;
  case 0x4000003b:
    return SDLK12_F2;
  case 0x4000003c:
    return SDLK12_F3;
  case 0x4000003d:
    return SDLK12_F4;
  case 0x4000003e:
    return SDLK12_F5;
  case 0x4000003f:
    return SDLK12_F6;
  case 0x40000040:
    return SDLK12_F7;
  case 0x40000041:
    return SDLK12_F8;
  case 0x40000042:
    return SDLK12_F9;
  case 0x40000043:
    return SDLK12_F10;
  case 0x40000044:
    return SDLK12_F11;
  case 0x40000045:
    return SDLK12_F12;
  case 0x40000046:
    return SDLK12_PRINT;
  case 0x40000047:
    return SDLK12_SCROLLOCK;
  case 0x40000048:
    SVar1 = SDLK12_PAUSE;
    break;
  case 0x40000049:
    return SDLK12_INSERT;
  case 0x4000004a:
    return SDLK12_HOME;
  case 0x4000004b:
    return SDLK12_PAGEUP;
  case 0x4000004c:
  case 0x40000064:
  case 0x40000065:
  case 0x4000006b:
  case 0x4000006c:
  case 0x4000006d:
  case 0x4000006e:
  case 0x4000006f:
  case 0x40000070:
  case 0x40000071:
  case 0x40000072:
  case 0x40000073:
  case 0x40000074:
  case 0x40000077:
  case 0x40000078:
  case 0x40000079:
  case 0x4000007b:
  case 0x4000007c:
  case 0x4000007d:
  case 0x4000007e:
  case 0x4000007f:
  case 0x40000080:
  case 0x40000081:
  case 0x40000082:
  case 0x40000083:
  case 0x40000084:
  case 0x40000085:
  case 0x40000086:
  case 0x40000087:
  case 0x40000088:
  case 0x40000089:
  case 0x4000008a:
  case 0x4000008b:
  case 0x4000008c:
  case 0x4000008d:
  case 0x4000008e:
  case 0x4000008f:
  case 0x40000090:
  case 0x40000091:
  case 0x40000092:
  case 0x40000093:
  case 0x40000094:
  case 0x40000095:
  case 0x40000096:
  case 0x40000097:
  case 0x40000098:
  case 0x40000099:
  case 0x4000009b:
switchD_0011451b_caseD_2262:
    return SDLK12_FIRST;
  case 0x4000004d:
    return SDLK12_END;
  case 0x4000004e:
    return SDLK12_PAGEDOWN;
  case 0x4000004f:
    return SDLK12_RIGHT;
  case 0x40000050:
    return SDLK12_LEFT;
  case 0x40000051:
    return SDLK12_DOWN;
  case 0x40000052:
    return SDLK12_UP;
  case 0x40000053:
    return SDLK12_NUMLOCK;
  case 0x40000054:
    return SDLK12_KP_DIVIDE;
  case 0x40000055:
    return SDLK12_KP_MULTIPLY;
  case 0x40000056:
    return SDLK12_KP_MINUS;
  case 0x40000057:
    return SDLK12_KP_PLUS;
  case 0x40000058:
    return SDLK12_KP_ENTER;
  case 0x40000059:
    return SDLK12_KP1;
  case 0x4000005a:
    return SDLK12_KP2;
  case 0x4000005b:
    return SDLK12_KP3;
  case 0x4000005c:
    return SDLK12_KP4;
  case 0x4000005d:
    return SDLK12_KP5;
  case 0x4000005e:
    return SDLK12_KP6;
  case 0x4000005f:
    return SDLK12_KP7;
  case 0x40000060:
    return SDLK12_KP8;
  case 0x40000061:
    return SDLK12_KP9;
  case 0x40000062:
    return SDLK12_KP0;
  case 0x40000063:
    return SDLK12_KP_PERIOD;
  case 0x40000066:
    return SDLK12_POWER;
  case 0x40000067:
    return SDLK12_KP_EQUALS;
  case 0x40000068:
    return SDLK12_F13;
  case 0x40000069:
    return SDLK12_F14;
  case 0x4000006a:
    return SDLK12_F15;
  case 0x40000075:
    return SDLK12_HELP;
  case 0x40000076:
    return SDLK12_MENU;
  case 0x4000007a:
    return SDLK12_UNDO;
  case 0x4000009a:
    return SDLK12_SYSREQ;
  case 0x4000009c:
    SVar1 = SDLK12_CLEAR;
    break;
  default:
    switch(keysym20) {
    case 0x2002:
      goto switchD_001143c5_caseD_2002;
    case 0x2003:
      goto switchD_001143c5_caseD_2003;
    case 0x2004:
      goto switchD_001143c5_caseD_2004;
    case 0x2005:
      goto switchD_001143c5_caseD_2005;
    case 0x2006:
    case 0x200b:
    case 0x200c:
    case 0x200d:
    case 0x200e:
    case 0x200f:
    case 0x2010:
    case 0x2011:
    case 0x2016:
    case 0x201b:
    case 0x201f:
    case 0x2023:
    case 0x2024:
    case 0x2027:
    case 0x2028:
    case 0x2029:
    case 0x202a:
    case 0x202b:
    case 0x202c:
    case 0x202d:
    case 0x202e:
    case 0x202f:
    case 0x2031:
    case 0x2034:
    case 0x2035:
    case 0x2036:
    case 0x2037:
    case 0x2039:
    case 0x203a:
    case 0x203b:
    case 0x203c:
    case 0x203d:
      goto switchD_0011451b_caseD_2262;
    case 0x2007:
      goto switchD_001143c5_caseD_2007;
    case 0x2008:
      goto switchD_001143c5_caseD_2008;
    case 0x2009:
switchD_00114407_caseD_23a1:
      return SDLK12_WORLD_7;
    case 0x200a:
switchD_00114407_caseD_23a3:
      return SDLK12_WORLD_8;
    case 0x2012:
      goto switchD_001143c5_caseD_2012;
    case 0x2013:
      goto switchD_00114407_caseD_23a6;
    case 0x2014:
      goto switchD_00114407_caseD_23a4;
    case 0x2015:
    case 0x2025:
switchD_00114407_caseD_23a8:
      return SDLK12_WORLD_15;
    case 0x2017:
switchD_001143db_caseD_25ae:
      return SDLK12_WORLD_63;
    case 0x2018:
      goto switchD_001143c5_caseD_2018;
    case 0x2019:
      goto switchD_001143c5_caseD_2019;
    case 0x201a:
      return SDLK12_WORLD_93;
    case 0x201c:
      goto switchD_001143c5_caseD_201c;
    case 0x201d:
      goto switchD_001143c5_caseD_201d;
    case 0x201e:
      return SDLK12_WORLD_94;
    case 0x2020:
      goto switchD_001143c5_caseD_2020;
    case 0x2021:
      goto switchD_001143c5_caseD_2021;
    case 0x2022:
      goto switchD_001143c5_caseD_2022;
    case 0x2026:
switchD_00114407_caseD_23a0:
      return SDLK12_WORLD_14;
    case 0x2030:
      goto switchD_001143c5_caseD_2030;
    case 0x2032:
      goto switchD_0011441d_caseD_221a;
    case 0x2033:
      goto switchD_001143c5_caseD_2033;
    case 0x2038:
      return SDLK12_WORLD_92;
    case 0x203e:
      return 0x7e;
    default:
      switch(keysym20) {
      case 0x25aa:
        goto switchD_001143db_caseD_25aa;
      case 0x25ab:
        goto switchD_001143db_caseD_25ab;
      case 0x25ac:
        return SDLK12_WORLD_59;
      case 0x25ad:
        goto switchD_001143db_caseD_25ad;
      case 0x25ae:
        goto switchD_001143db_caseD_25ae;
      case 0x25af:
        goto switchD_0011451b_caseD_2261;
      case 0x25b0:
      case 0x25b1:
      case 0x25b4:
      case 0x25b5:
      case 0x25b8:
      case 0x25b9:
      case 0x25ba:
      case 0x25bb:
      case 0x25be:
      case 0x25bf:
      case 0x25c2:
      case 0x25c3:
      case 0x25c4:
      case 0x25c5:
      case 0x25c6:
      case 0x25c7:
      case 0x25c8:
      case 0x25c9:
      case 0x25ca:
      case 0x25cc:
      case 0x25cd:
      case 0x25ce:
        goto switchD_0011451b_caseD_2262;
      case 0x25b2:
        goto switchD_001143db_caseD_25b2;
      case 0x25b3:
        goto switchD_001143db_caseD_25b3;
      case 0x25b6:
        goto switchD_0011441d_caseD_222a;
      case 0x25b7:
        goto switchD_001143db_caseD_25b7;
      case 0x25bc:
        goto switchD_001143db_caseD_25bc;
      case 0x25bd:
        goto switchD_001143db_caseD_25bd;
      case 0x25c0:
        goto switchD_0011441d_caseD_2229;
      case 0x25c1:
        goto switchD_001143db_caseD_25c1;
      case 0x25cb:
        goto switchD_001143db_caseD_25cb;
      case 0x25cf:
switchD_0011441d_caseD_2227:
        return SDLK12_WORLD_62;
      default:
        switch(keysym20) {
        case 0x2153:
switchD_00114407_caseD_23ac:
          return SDLK12_WORLD_16;
        case 0x2154:
          goto switchD_001143f1_caseD_2154;
        case 0x2155:
          goto switchD_001143f1_caseD_2155;
        case 0x2156:
          goto switchD_001143f1_caseD_2156;
        case 0x2157:
          goto switchD_001143f1_caseD_2157;
        case 0x2158:
          goto switchD_001143f1_caseD_2158;
        case 0x2159:
          goto switchD_001143f1_caseD_2159;
        case 0x215a:
          goto switchD_001143f1_caseD_215a;
        case 0x215b:
          goto switchD_001143f1_caseD_215b;
        case 0x215c:
          goto switchD_001143f1_caseD_215c;
        case 0x215d:
          goto switchD_001143f1_caseD_215d;
        case 0x215e:
          goto switchD_001143f1_caseD_215e;
        default:
          switch(keysym20) {
          case 0x239b:
            goto switchD_00114407_caseD_239b;
          case 0x239c:
          case 0x239f:
          case 0x23a2:
          case 0x23a5:
          case 0x23a7:
          case 0x23a9:
          case 0x23aa:
          case 0x23ab:
            goto switchD_0011451b_caseD_2262;
          case 0x239d:
            goto switchD_00114407_caseD_239d;
          case 0x239e:
            goto switchD_00114407_caseD_239e;
          case 0x23a0:
            goto switchD_00114407_caseD_23a0;
          case 0x23a1:
            goto switchD_00114407_caseD_23a1;
          case 0x23a3:
            goto switchD_00114407_caseD_23a3;
          case 0x23a4:
            goto switchD_00114407_caseD_23a4;
          case 0x23a6:
            goto switchD_00114407_caseD_23a6;
          case 0x23a8:
            goto switchD_00114407_caseD_23a8;
          case 0x23ac:
            goto switchD_00114407_caseD_23ac;
          default:
            switch(keysym20) {
            case 0x221a:
              goto switchD_0011441d_caseD_221a;
            case 0x221b:
            case 0x221c:
            case 0x221f:
            case 0x2220:
            case 0x2221:
            case 0x2222:
            case 0x2223:
            case 0x2224:
            case 0x2225:
            case 0x2226:
              goto switchD_0011451b_caseD_2262;
            case 0x221d:
              goto switchD_0011441d_caseD_221d;
            case 0x221e:
              goto switchD_0011441d_caseD_221e;
            case 0x2227:
              goto switchD_0011441d_caseD_2227;
            case 0x2228:
              goto switchD_0011441d_caseD_2228;
            case 0x2229:
              goto switchD_0011441d_caseD_2229;
            case 0x222a:
              goto switchD_0011441d_caseD_222a;
            case 0x222b:
              goto switchD_0011441d_caseD_222b;
            default:
              switch(keysym20) {
              case 0x400000e0:
                return SDLK12_LCTRL;
              case 0x400000e1:
                return SDLK12_LSHIFT;
              case 0x400000e2:
                return SDLK12_LALT;
              case 0x400000e3:
                return SDLK12_LMETA;
              case 0x400000e4:
                return SDLK12_RCTRL;
              case 0x400000e5:
                return SDLK12_RSHIFT;
              case 0x400000e6:
                return SDLK12_RALT;
              case 0x400000e7:
                return SDLK12_RMETA;
              }
              switch(keysym20) {
              case 0x2190:
                return SDLK12_WORLD_91;
              case 0x2191:
                goto switchD_001145a3_caseD_2191;
              case 0x2192:
                goto switchD_001145a3_caseD_2192;
              case 0x2193:
                goto switchD_001145a3_caseD_2193;
              }
              switch(keysym20) {
              case 0x2260:
                goto switchD_0011451b_caseD_2260;
              case 0x2261:
                goto switchD_0011451b_caseD_2261;
              case 0x2262:
              case 0x2263:
                goto switchD_0011451b_caseD_2262;
              case 0x2264:
                goto switchD_0011451b_caseD_2264;
              case 0x2265:
                return SDLK12_WORLD_30;
              default:
                if (keysym20 == 0x490) {
                  return SDLK12_WORLD_29;
                }
                if (keysym20 == 0x491) {
                  return SDLK12_WORLD_13;
                }
                if (keysym20 == 0x2105) {
                  return SDLK12_WORLD_24;
                }
                if (keysym20 == 0x2116) {
                  return SDLK12_WORLD_16;
                }
                if (keysym20 == 0x2117) {
                  return SDLK12_WORLD_91;
                }
                if (keysym20 == 0x211e) {
                  return SDLK12_WORLD_52;
                }
                if (keysym20 == 0x2122) {
                  return SDLK12_WORLD_41;
                }
                if (keysym20 == 0x21d2) {
                  return SDLK12_WORLD_46;
                }
                if (keysym20 == 0x21d4) {
                  return SDLK12_WORLD_45;
                }
                if (keysym20 == 0x2202) {
                  return SDLK12_WORLD_79;
                }
                if (keysym20 == 0x2207) {
                  return SDLK12_WORLD_37;
                }
                if (keysym20 == 0x2234) {
                  return SDLK12_WORLD_32;
                }
                if (keysym20 == 0x223c) {
                  return SDLK12_WORLD_40;
                }
                if (keysym20 == 0x2243) {
                  return SDLK12_WORLD_41;
                }
                if (keysym20 == 0x2282) {
                  return SDLK12_WORLD_58;
                }
                if (keysym20 == 0x2283) {
                  return SDLK12_WORLD_59;
                }
                if (keysym20 == 0x2315) {
                  return SDLK12_WORLD_90;
                }
                if (keysym20 == 0x2320) {
                  return SDLK12_WORLD_4;
                }
                if (keysym20 == 0x2321) {
                  return SDLK12_WORLD_5;
                }
                if (keysym20 == 0x23b7) {
                  return SDLK12_WORLD_1;
                }
                if (keysym20 == 0x2423) {
                  return SDLK12_WORLD_12;
                }
                if (keysym20 == 0x2500) {
                  return SDLK12_WORLD_3;
                }
                if (keysym20 == 0x2502) {
                  return SDLK12_WORLD_6;
                }
                if (keysym20 == 0x250c) {
                  return SDLK12_WORLD_2;
                }
                if (keysym20 == 0x25e6) {
                  return SDLK12_WORLD_64;
                }
                if (keysym20 == 0x2606) {
                  return SDLK12_WORLD_69;
                }
                if (keysym20 == 0x260e) {
                  return SDLK12_WORLD_89;
                }
                if (keysym20 == 0x2613) {
                  return SDLK12_WORLD_42;
                }
                if (keysym20 == 0x261c) {
                  return SDLK12_WORLD_74;
                }
                if (keysym20 == 0x261e) {
                  return SDLK12_WORLD_75;
                }
                if (keysym20 == 0x2640) {
                  return SDLK12_WORLD_88;
                }
                if (keysym20 != 0x2642) {
                  if (keysym20 == 0x2663) {
                    return SDLK12_WORLD_76;
                  }
                  if (keysym20 == 0x2665) {
                    return SDLK12_WORLD_78;
                  }
                  if (keysym20 == 0x2666) {
                    return SDLK12_WORLD_77;
                  }
                  if (keysym20 == 0x266d) {
                    return SDLK12_WORLD_86;
                  }
                  if (keysym20 == 0x266f) {
                    return SDLK12_WORLD_85;
                  }
                  if (keysym20 == 0x2713) {
                    return SDLK12_WORLD_83;
                  }
                  if (keysym20 == 0x2717) {
                    return SDLK12_WORLD_84;
                  }
                  if (keysym20 == 0x271d) {
                    return SDLK12_WORLD_57;
                  }
                  if (keysym20 == 0x2720) {
                    return SDLK12_WORLD_80;
                  }
                  if (keysym20 == 0x27e8) {
                    return SDLK12_WORLD_28;
                  }
                  if (keysym20 == 0x27e9) {
                    return SDLK12_WORLD_30;
                  }
                  if (keysym20 == 0x3001) {
                    return SDLK12_WORLD_4;
                  }
                  if (keysym20 == 0x3002) {
                    return SDLK12_WORLD_1;
                  }
                  if (keysym20 == 0x300c) {
                    return SDLK12_WORLD_2;
                  }
                  if (keysym20 == 0x300d) {
                    return SDLK12_WORLD_3;
                  }
                  if (keysym20 != 0x40000101) {
                    return SDLK12_FIRST;
                  }
                  return SDLK12_MODE;
                }
                return SDLK12_WORLD_87;
              }
            }
          }
        }
      }
    }
  }
  return SVar1;
}

Assistant:

static SDL12Key
Keysym20to12(const SDL_Keycode keysym20)
{
    if (((int) keysym20) <= 255) {
        /* (most of) low-ASCII maps directly,
         * and so does the Latin-1 range (128-255) */
        if (keysym20 == SDLK_PAUSE) {
            return SDLK12_PAUSE;
        }
        if (keysym20 == SDLK_CLEAR) {
            return SDLK12_CLEAR;
        }
        return (SDL12Key) keysym20;
    }

    switch (keysym20) {
    #define CASEKEYSYM20TO12(k20, k12) case SDLK_##k20: return SDLK12_##k12
    CASEKEYSYM20TO12(KP_0, KP0);
    CASEKEYSYM20TO12(KP_1, KP1);
    CASEKEYSYM20TO12(KP_2, KP2);
    CASEKEYSYM20TO12(KP_3, KP3);
    CASEKEYSYM20TO12(KP_4, KP4);
    CASEKEYSYM20TO12(KP_5, KP5);
    CASEKEYSYM20TO12(KP_6, KP6);
    CASEKEYSYM20TO12(KP_7, KP7);
    CASEKEYSYM20TO12(KP_8, KP8);
    CASEKEYSYM20TO12(KP_9, KP9);
    CASEKEYSYM20TO12(NUMLOCKCLEAR, NUMLOCK);
    CASEKEYSYM20TO12(SCROLLLOCK, SCROLLOCK);
    CASEKEYSYM20TO12(RGUI, RMETA);
    CASEKEYSYM20TO12(LGUI, LMETA);
    CASEKEYSYM20TO12(PRINTSCREEN, PRINT);
    #undef CASEKEYSYM20TO12

    #define CASEKEYSYM20TO12(k) case SDLK_##k: return SDLK12_##k
    CASEKEYSYM20TO12(CLEAR);
    CASEKEYSYM20TO12(PAUSE);
    CASEKEYSYM20TO12(KP_PERIOD);
    CASEKEYSYM20TO12(KP_DIVIDE);
    CASEKEYSYM20TO12(KP_MULTIPLY);
    CASEKEYSYM20TO12(KP_MINUS);
    CASEKEYSYM20TO12(KP_PLUS);
    CASEKEYSYM20TO12(KP_ENTER);
    CASEKEYSYM20TO12(KP_EQUALS);
    CASEKEYSYM20TO12(UP);
    CASEKEYSYM20TO12(DOWN);
    CASEKEYSYM20TO12(RIGHT);
    CASEKEYSYM20TO12(LEFT);
    CASEKEYSYM20TO12(INSERT);
    CASEKEYSYM20TO12(HOME);
    CASEKEYSYM20TO12(END);
    CASEKEYSYM20TO12(PAGEUP);
    CASEKEYSYM20TO12(PAGEDOWN);
    CASEKEYSYM20TO12(F1);
    CASEKEYSYM20TO12(F2);
    CASEKEYSYM20TO12(F3);
    CASEKEYSYM20TO12(F4);
    CASEKEYSYM20TO12(F5);
    CASEKEYSYM20TO12(F6);
    CASEKEYSYM20TO12(F7);
    CASEKEYSYM20TO12(F8);
    CASEKEYSYM20TO12(F9);
    CASEKEYSYM20TO12(F10);
    CASEKEYSYM20TO12(F11);
    CASEKEYSYM20TO12(F12);
    CASEKEYSYM20TO12(F13);
    CASEKEYSYM20TO12(F14);
    CASEKEYSYM20TO12(F15);
    CASEKEYSYM20TO12(CAPSLOCK);
    CASEKEYSYM20TO12(RSHIFT);
    CASEKEYSYM20TO12(LSHIFT);
    CASEKEYSYM20TO12(RCTRL);
    CASEKEYSYM20TO12(LCTRL);
    CASEKEYSYM20TO12(RALT);
    CASEKEYSYM20TO12(LALT);
    CASEKEYSYM20TO12(MODE);
    CASEKEYSYM20TO12(HELP);
    CASEKEYSYM20TO12(SYSREQ);
    CASEKEYSYM20TO12(MENU);
    CASEKEYSYM20TO12(POWER);
    CASEKEYSYM20TO12(UNDO);
    #undef CASEKEYSYM20TO12

    /* Map the "World Keys" (SDLK_WORLD_0 = 0xA0 to SDLK_WORLD_95 = 0xFF).
     * In SDL2 they're the UCS-4 (32bit unicode) code for the key,
     * in SDL1.2 (on X11 at least) they were the X11_KeySym & 0xFF,
     * if (X11_KeySym >> 8)) was either 0 to 8 or 0x0A or 0x0C or 0x0E
     * So map all those used UCS-4 codes to the corresponding SDLK12_WORLD_* codes
     * Note that the Latin-1 range (keysym20 <= 255) is already handled at the top of this function
     * Luckily X11's keysymdef.h lists both the values of the constants and their UCS4-value, like
     * #define XK_Aogonek                       0x01a1  / * U+0104 LATIN CAPITAL LETTER A WITH OGONEK * /
     * So I'm using that as a reference for our mappings, which only use
     * the lowest byte of the XK_* value, because of X11_KeySym & 0xFF in SDL1.2
     *
     * case UCS4_code: return (SDL12Key)lowest_byte_of_corresponding_X11_KeySym; */

    /* Latin-2 */
    case 0x0104: return (SDL12Key)0xa1;
    case 0x02D8: return (SDL12Key)0xa2;
    case 0x0141: return (SDL12Key)0xa3;
    case 0x013D: return (SDL12Key)0xa5;
    case 0x015A: return (SDL12Key)0xa6;
    case 0x0160: return (SDL12Key)0xa9;
    case 0x015E: return (SDL12Key)0xaa;
    case 0x0164: return (SDL12Key)0xab;
    case 0x0179: return (SDL12Key)0xac;
    case 0x017D: return (SDL12Key)0xae;
    case 0x017B: return (SDL12Key)0xaf;
    case 0x0105: return (SDL12Key)0xb1;
    case 0x02DB: return (SDL12Key)0xb2;
    case 0x0142: return (SDL12Key)0xb3;
    case 0x013E: return (SDL12Key)0xb5;
    case 0x015B: return (SDL12Key)0xb6;
    case 0x02C7: return (SDL12Key)0xb7;
    case 0x0161: return (SDL12Key)0xb9;
    case 0x015F: return (SDL12Key)0xba;
    case 0x0165: return (SDL12Key)0xbb;
    case 0x017A: return (SDL12Key)0xbc;
    case 0x02DD: return (SDL12Key)0xbd;
    case 0x017E: return (SDL12Key)0xbe;
    case 0x017C: return (SDL12Key)0xbf;
    case 0x0154: return (SDL12Key)0xc0;
    case 0x0102: return (SDL12Key)0xc3;
    case 0x0139: return (SDL12Key)0xc5;
    case 0x0106: return (SDL12Key)0xc6;
    case 0x010C: return (SDL12Key)0xc8;
    case 0x0118: return (SDL12Key)0xca;
    case 0x011A: return (SDL12Key)0xcc;
    case 0x010E: return (SDL12Key)0xcf;
    case 0x0110: return (SDL12Key)0xd0;
    case 0x0143: return (SDL12Key)0xd1;
    case 0x0147: return (SDL12Key)0xd2;
    case 0x0150: return (SDL12Key)0xd5;
    case 0x0158: return (SDL12Key)0xd8;
    case 0x016E: return (SDL12Key)0xd9;
    case 0x0170: return (SDL12Key)0xdb;
    case 0x0162: return (SDL12Key)0xde;
    case 0x0155: return (SDL12Key)0xe0;
    case 0x0103: return (SDL12Key)0xe3;
    case 0x013A: return (SDL12Key)0xe5;
    case 0x0107: return (SDL12Key)0xe6;
    case 0x010D: return (SDL12Key)0xe8;
    case 0x0119: return (SDL12Key)0xea;
    case 0x011B: return (SDL12Key)0xec;
    case 0x010F: return (SDL12Key)0xef;
    case 0x0111: return (SDL12Key)0xf0;
    case 0x0144: return (SDL12Key)0xf1;
    case 0x0148: return (SDL12Key)0xf2;
    case 0x0151: return (SDL12Key)0xf5;
    case 0x0159: return (SDL12Key)0xf8;
    case 0x016F: return (SDL12Key)0xf9;
    case 0x0171: return (SDL12Key)0xfb;
    case 0x0163: return (SDL12Key)0xfe;
    case 0x02D9: return (SDL12Key)0xff;
    /* Latin-3 */
    case 0x0126: return (SDL12Key)0xa1;
    case 0x0124: return (SDL12Key)0xa6;
    case 0x0130: return (SDL12Key)0xa9;
    case 0x011E: return (SDL12Key)0xab;
    case 0x0134: return (SDL12Key)0xac;
    case 0x0127: return (SDL12Key)0xb1;
    case 0x0125: return (SDL12Key)0xb6;
    case 0x0131: return (SDL12Key)0xb9;
    case 0x011F: return (SDL12Key)0xbb;
    case 0x0135: return (SDL12Key)0xbc;
    case 0x010A: return (SDL12Key)0xc5;
    case 0x0108: return (SDL12Key)0xc6;
    case 0x0120: return (SDL12Key)0xd5;
    case 0x011C: return (SDL12Key)0xd8;
    case 0x016C: return (SDL12Key)0xdd;
    case 0x015C: return (SDL12Key)0xde;
    case 0x010B: return (SDL12Key)0xe5;
    case 0x0109: return (SDL12Key)0xe6;
    case 0x0121: return (SDL12Key)0xf5;
    case 0x011D: return (SDL12Key)0xf8;
    case 0x016D: return (SDL12Key)0xfd;
    case 0x015D: return (SDL12Key)0xfe;
    /* Latin 4 */
    case 0x0138: return (SDL12Key)0xa2;
    case 0x0156: return (SDL12Key)0xa3;
    case 0x0128: return (SDL12Key)0xa5;
    case 0x013B: return (SDL12Key)0xa6;
    case 0x0112: return (SDL12Key)0xaa;
    case 0x0122: return (SDL12Key)0xab;
    case 0x0166: return (SDL12Key)0xac;
    case 0x0157: return (SDL12Key)0xb3;
    case 0x0129: return (SDL12Key)0xb5;
    case 0x013C: return (SDL12Key)0xb6;
    case 0x0113: return (SDL12Key)0xba;
    case 0x0123: return (SDL12Key)0xbb;
    case 0x0167: return (SDL12Key)0xbc;
    case 0x014A: return (SDL12Key)0xbd;
    case 0x014B: return (SDL12Key)0xbf;
    case 0x0100: return (SDL12Key)0xc0;
    case 0x012E: return (SDL12Key)0xc7;
    case 0x0116: return (SDL12Key)0xcc;
    case 0x012A: return (SDL12Key)0xcf;
    case 0x0145: return (SDL12Key)0xd1;
    case 0x014C: return (SDL12Key)0xd2;
    case 0x0136: return (SDL12Key)0xd3;
    case 0x0172: return (SDL12Key)0xd9;
    case 0x0168: return (SDL12Key)0xdd;
    case 0x016A: return (SDL12Key)0xde;
    case 0x0101: return (SDL12Key)0xe0;
    case 0x012F: return (SDL12Key)0xe7;
    case 0x0117: return (SDL12Key)0xec;
    case 0x012B: return (SDL12Key)0xef;
    case 0x0146: return (SDL12Key)0xf1;
    case 0x014D: return (SDL12Key)0xf2;
    case 0x0137: return (SDL12Key)0xf3;
    case 0x0173: return (SDL12Key)0xf9;
    case 0x0169: return (SDL12Key)0xfd;
    case 0x016B: return (SDL12Key)0xfe;
    /* Katakana */
    case 0x203E: return (SDL12Key)0x7e;
    case 0x3002: return (SDL12Key)0xa1;
    case 0x300C: return (SDL12Key)0xa2;
    case 0x300D: return (SDL12Key)0xa3;
    case 0x3001: return (SDL12Key)0xa4;
    case 0x30FB: return (SDL12Key)0xa5;
    case 0x30F2: return (SDL12Key)0xa6;
    case 0x30A1: return (SDL12Key)0xa7;
    case 0x30A3: return (SDL12Key)0xa8;
    case 0x30A5: return (SDL12Key)0xa9;
    case 0x30A7: return (SDL12Key)0xaa;
    case 0x30A9: return (SDL12Key)0xab;
    case 0x30E3: return (SDL12Key)0xac;
    case 0x30E5: return (SDL12Key)0xad;
    case 0x30E7: return (SDL12Key)0xae;
    case 0x30C3: return (SDL12Key)0xaf;
    case 0x30FC: return (SDL12Key)0xb0;
    case 0x30A2: return (SDL12Key)0xb1;
    case 0x30A4: return (SDL12Key)0xb2;
    case 0x30A6: return (SDL12Key)0xb3;
    case 0x30A8: return (SDL12Key)0xb4;
    case 0x30AA: return (SDL12Key)0xb5;
    case 0x30AB: return (SDL12Key)0xb6;
    case 0x30AD: return (SDL12Key)0xb7;
    case 0x30AF: return (SDL12Key)0xb8;
    case 0x30B1: return (SDL12Key)0xb9;
    case 0x30B3: return (SDL12Key)0xba;
    case 0x30B5: return (SDL12Key)0xbb;
    case 0x30B7: return (SDL12Key)0xbc;
    case 0x30B9: return (SDL12Key)0xbd;
    case 0x30BB: return (SDL12Key)0xbe;
    case 0x30BD: return (SDL12Key)0xbf;
    case 0x30BF: return (SDL12Key)0xc0;
    case 0x30C1: return (SDL12Key)0xc1;
    case 0x30C4: return (SDL12Key)0xc2;
    case 0x30C6: return (SDL12Key)0xc3;
    case 0x30C8: return (SDL12Key)0xc4;
    case 0x30CA: return (SDL12Key)0xc5;
    case 0x30CB: return (SDL12Key)0xc6;
    case 0x30CC: return (SDL12Key)0xc7;
    case 0x30CD: return (SDL12Key)0xc8;
    case 0x30CE: return (SDL12Key)0xc9;
    case 0x30CF: return (SDL12Key)0xca;
    case 0x30D2: return (SDL12Key)0xcb;
    case 0x30D5: return (SDL12Key)0xcc;
    case 0x30D8: return (SDL12Key)0xcd;
    case 0x30DB: return (SDL12Key)0xce;
    case 0x30DE: return (SDL12Key)0xcf;
    case 0x30DF: return (SDL12Key)0xd0;
    case 0x30E0: return (SDL12Key)0xd1;
    case 0x30E1: return (SDL12Key)0xd2;
    case 0x30E2: return (SDL12Key)0xd3;
    case 0x30E4: return (SDL12Key)0xd4;
    case 0x30E6: return (SDL12Key)0xd5;
    case 0x30E8: return (SDL12Key)0xd6;
    case 0x30E9: return (SDL12Key)0xd7;
    case 0x30EA: return (SDL12Key)0xd8;
    case 0x30EB: return (SDL12Key)0xd9;
    case 0x30EC: return (SDL12Key)0xda;
    case 0x30ED: return (SDL12Key)0xdb;
    case 0x30EF: return (SDL12Key)0xdc;
    case 0x30F3: return (SDL12Key)0xdd;
    case 0x309B: return (SDL12Key)0xde;
    case 0x309C: return (SDL12Key)0xdf;
    /* Arabic */
    case 0x060C: return (SDL12Key)0xac;
    case 0x061B: return (SDL12Key)0xbb;
    case 0x061F: return (SDL12Key)0xbf;
    case 0x0621: return (SDL12Key)0xc1;
    case 0x0622: return (SDL12Key)0xc2;
    case 0x0623: return (SDL12Key)0xc3;
    case 0x0624: return (SDL12Key)0xc4;
    case 0x0625: return (SDL12Key)0xc5;
    case 0x0626: return (SDL12Key)0xc6;
    case 0x0627: return (SDL12Key)0xc7;
    case 0x0628: return (SDL12Key)0xc8;
    case 0x0629: return (SDL12Key)0xc9;
    case 0x062A: return (SDL12Key)0xca;
    case 0x062B: return (SDL12Key)0xcb;
    case 0x062C: return (SDL12Key)0xcc;
    case 0x062D: return (SDL12Key)0xcd;
    case 0x062E: return (SDL12Key)0xce;
    case 0x062F: return (SDL12Key)0xcf;
    case 0x0630: return (SDL12Key)0xd0;
    case 0x0631: return (SDL12Key)0xd1;
    case 0x0632: return (SDL12Key)0xd2;
    case 0x0633: return (SDL12Key)0xd3;
    case 0x0634: return (SDL12Key)0xd4;
    case 0x0635: return (SDL12Key)0xd5;
    case 0x0636: return (SDL12Key)0xd6;
    case 0x0637: return (SDL12Key)0xd7;
    case 0x0638: return (SDL12Key)0xd8;
    case 0x0639: return (SDL12Key)0xd9;
    case 0x063A: return (SDL12Key)0xda;
    case 0x0640: return (SDL12Key)0xe0;
    case 0x0641: return (SDL12Key)0xe1;
    case 0x0642: return (SDL12Key)0xe2;
    case 0x0643: return (SDL12Key)0xe3;
    case 0x0644: return (SDL12Key)0xe4;
    case 0x0645: return (SDL12Key)0xe5;
    case 0x0646: return (SDL12Key)0xe6;
    case 0x0647: return (SDL12Key)0xe7;
    case 0x0648: return (SDL12Key)0xe8;
    case 0x0649: return (SDL12Key)0xe9;
    case 0x064A: return (SDL12Key)0xea;
    case 0x064B: return (SDL12Key)0xeb;
    case 0x064C: return (SDL12Key)0xec;
    case 0x064D: return (SDL12Key)0xed;
    case 0x064E: return (SDL12Key)0xee;
    case 0x064F: return (SDL12Key)0xef;
    case 0x0650: return (SDL12Key)0xf0;
    case 0x0651: return (SDL12Key)0xf1;
    case 0x0652: return (SDL12Key)0xf2;
    /* Cyrillic */
    case 0x0452: return (SDL12Key)0xa1;
    case 0x0453: return (SDL12Key)0xa2;
    case 0x0451: return (SDL12Key)0xa3;
    case 0x0454: return (SDL12Key)0xa4;
    case 0x0455: return (SDL12Key)0xa5;
    case 0x0456: return (SDL12Key)0xa6;
    case 0x0457: return (SDL12Key)0xa7;
    case 0x0458: return (SDL12Key)0xa8;
    case 0x0459: return (SDL12Key)0xa9;
    case 0x045A: return (SDL12Key)0xaa;
    case 0x045B: return (SDL12Key)0xab;
    case 0x045C: return (SDL12Key)0xac;
    case 0x0491: return (SDL12Key)0xad;
    case 0x045E: return (SDL12Key)0xae;
    case 0x045F: return (SDL12Key)0xaf;
    case 0x2116: return (SDL12Key)0xb0;
    case 0x0402: return (SDL12Key)0xb1;
    case 0x0403: return (SDL12Key)0xb2;
    case 0x0401: return (SDL12Key)0xb3;
    case 0x0404: return (SDL12Key)0xb4;
    case 0x0405: return (SDL12Key)0xb5;
    case 0x0406: return (SDL12Key)0xb6;
    case 0x0407: return (SDL12Key)0xb7;
    case 0x0408: return (SDL12Key)0xb8;
    case 0x0409: return (SDL12Key)0xb9;
    case 0x040A: return (SDL12Key)0xba;
    case 0x040B: return (SDL12Key)0xbb;
    case 0x040C: return (SDL12Key)0xbc;
    case 0x0490: return (SDL12Key)0xbd;
    case 0x040E: return (SDL12Key)0xbe;
    case 0x040F: return (SDL12Key)0xbf;
    case 0x044E: return (SDL12Key)0xc0;
    case 0x0430: return (SDL12Key)0xc1;
    case 0x0431: return (SDL12Key)0xc2;
    case 0x0446: return (SDL12Key)0xc3;
    case 0x0434: return (SDL12Key)0xc4;
    case 0x0435: return (SDL12Key)0xc5;
    case 0x0444: return (SDL12Key)0xc6;
    case 0x0433: return (SDL12Key)0xc7;
    case 0x0445: return (SDL12Key)0xc8;
    case 0x0438: return (SDL12Key)0xc9;
    case 0x0439: return (SDL12Key)0xca;
    case 0x043A: return (SDL12Key)0xcb;
    case 0x043B: return (SDL12Key)0xcc;
    case 0x043C: return (SDL12Key)0xcd;
    case 0x043D: return (SDL12Key)0xce;
    case 0x043E: return (SDL12Key)0xcf;
    case 0x043F: return (SDL12Key)0xd0;
    case 0x044F: return (SDL12Key)0xd1;
    case 0x0440: return (SDL12Key)0xd2;
    case 0x0441: return (SDL12Key)0xd3;
    case 0x0442: return (SDL12Key)0xd4;
    case 0x0443: return (SDL12Key)0xd5;
    case 0x0436: return (SDL12Key)0xd6;
    case 0x0432: return (SDL12Key)0xd7;
    case 0x044C: return (SDL12Key)0xd8;
    case 0x044B: return (SDL12Key)0xd9;
    case 0x0437: return (SDL12Key)0xda;
    case 0x0448: return (SDL12Key)0xdb;
    case 0x044D: return (SDL12Key)0xdc;
    case 0x0449: return (SDL12Key)0xdd;
    case 0x0447: return (SDL12Key)0xde;
    case 0x044A: return (SDL12Key)0xdf;
    case 0x042E: return (SDL12Key)0xe0;
    case 0x0410: return (SDL12Key)0xe1;
    case 0x0411: return (SDL12Key)0xe2;
    case 0x0426: return (SDL12Key)0xe3;
    case 0x0414: return (SDL12Key)0xe4;
    case 0x0415: return (SDL12Key)0xe5;
    case 0x0424: return (SDL12Key)0xe6;
    case 0x0413: return (SDL12Key)0xe7;
    case 0x0425: return (SDL12Key)0xe8;
    case 0x0418: return (SDL12Key)0xe9;
    case 0x0419: return (SDL12Key)0xea;
    case 0x041A: return (SDL12Key)0xeb;
    case 0x041B: return (SDL12Key)0xec;
    case 0x041C: return (SDL12Key)0xed;
    case 0x041D: return (SDL12Key)0xee;
    case 0x041E: return (SDL12Key)0xef;
    case 0x041F: return (SDL12Key)0xf0;
    case 0x042F: return (SDL12Key)0xf1;
    case 0x0420: return (SDL12Key)0xf2;
    case 0x0421: return (SDL12Key)0xf3;
    case 0x0422: return (SDL12Key)0xf4;
    case 0x0423: return (SDL12Key)0xf5;
    case 0x0416: return (SDL12Key)0xf6;
    case 0x0412: return (SDL12Key)0xf7;
    case 0x042C: return (SDL12Key)0xf8;
    case 0x042B: return (SDL12Key)0xf9;
    case 0x0417: return (SDL12Key)0xfa;
    case 0x0428: return (SDL12Key)0xfb;
    case 0x042D: return (SDL12Key)0xfc;
    case 0x0429: return (SDL12Key)0xfd;
    case 0x0427: return (SDL12Key)0xfe;
    case 0x042A: return (SDL12Key)0xff;
    /* Greek */
    case 0x0386: return (SDL12Key)0xa1;
    case 0x0388: return (SDL12Key)0xa2;
    case 0x0389: return (SDL12Key)0xa3;
    case 0x038A: return (SDL12Key)0xa4;
    case 0x03AA: return (SDL12Key)0xa5;
    case 0x038C: return (SDL12Key)0xa7;
    case 0x038E: return (SDL12Key)0xa8;
    case 0x03AB: return (SDL12Key)0xa9;
    case 0x038F: return (SDL12Key)0xab;
    case 0x0385: return (SDL12Key)0xae;
    case 0x2015: return (SDL12Key)0xaf;
    case 0x03AC: return (SDL12Key)0xb1;
    case 0x03AD: return (SDL12Key)0xb2;
    case 0x03AE: return (SDL12Key)0xb3;
    case 0x03AF: return (SDL12Key)0xb4;
    case 0x03CA: return (SDL12Key)0xb5;
    case 0x0390: return (SDL12Key)0xb6;
    case 0x03CC: return (SDL12Key)0xb7;
    case 0x03CD: return (SDL12Key)0xb8;
    case 0x03CB: return (SDL12Key)0xb9;
    case 0x03B0: return (SDL12Key)0xba;
    case 0x03CE: return (SDL12Key)0xbb;
    case 0x0391: return (SDL12Key)0xc1;
    case 0x0392: return (SDL12Key)0xc2;
    case 0x0393: return (SDL12Key)0xc3;
    case 0x0394: return (SDL12Key)0xc4;
    case 0x0395: return (SDL12Key)0xc5;
    case 0x0396: return (SDL12Key)0xc6;
    case 0x0397: return (SDL12Key)0xc7;
    case 0x0398: return (SDL12Key)0xc8;
    case 0x0399: return (SDL12Key)0xc9;
    case 0x039A: return (SDL12Key)0xca;
    case 0x039B: return (SDL12Key)0xcb;
    case 0x039C: return (SDL12Key)0xcc;
    case 0x039D: return (SDL12Key)0xcd;
    case 0x039E: return (SDL12Key)0xce;
    case 0x039F: return (SDL12Key)0xcf;
    case 0x03A0: return (SDL12Key)0xd0;
    case 0x03A1: return (SDL12Key)0xd1;
    case 0x03A3: return (SDL12Key)0xd2;
    case 0x03A4: return (SDL12Key)0xd4;
    case 0x03A5: return (SDL12Key)0xd5;
    case 0x03A6: return (SDL12Key)0xd6;
    case 0x03A7: return (SDL12Key)0xd7;
    case 0x03A8: return (SDL12Key)0xd8;
    case 0x03A9: return (SDL12Key)0xd9;
    case 0x03B1: return (SDL12Key)0xe1;
    case 0x03B2: return (SDL12Key)0xe2;
    case 0x03B3: return (SDL12Key)0xe3;
    case 0x03B4: return (SDL12Key)0xe4;
    case 0x03B5: return (SDL12Key)0xe5;
    case 0x03B6: return (SDL12Key)0xe6;
    case 0x03B7: return (SDL12Key)0xe7;
    case 0x03B8: return (SDL12Key)0xe8;
    case 0x03B9: return (SDL12Key)0xe9;
    case 0x03BA: return (SDL12Key)0xea;
    case 0x03BB: return (SDL12Key)0xeb;
    case 0x03BC: return (SDL12Key)0xec;
    case 0x03BD: return (SDL12Key)0xed;
    case 0x03BE: return (SDL12Key)0xee;
    case 0x03BF: return (SDL12Key)0xef;
    case 0x03C0: return (SDL12Key)0xf0;
    case 0x03C1: return (SDL12Key)0xf1;
    case 0x03C3: return (SDL12Key)0xf2;
    case 0x03C2: return (SDL12Key)0xf3;
    case 0x03C4: return (SDL12Key)0xf4;
    case 0x03C5: return (SDL12Key)0xf5;
    case 0x03C6: return (SDL12Key)0xf6;
    case 0x03C7: return (SDL12Key)0xf7;
    case 0x03C8: return (SDL12Key)0xf8;
    case 0x03C9: return (SDL12Key)0xf9;
    /* Technical */
    case 0x23B7: return (SDL12Key)0xa1;
    case 0x250C: return (SDL12Key)0xa2;
    case 0x2500: return (SDL12Key)0xa3;
    case 0x2320: return (SDL12Key)0xa4;
    case 0x2321: return (SDL12Key)0xa5;
    case 0x2502: return (SDL12Key)0xa6;
    case 0x23A1: return (SDL12Key)0xa7;
    case 0x23A3: return (SDL12Key)0xa8;
    case 0x23A4: return (SDL12Key)0xa9;
    case 0x23A6: return (SDL12Key)0xaa;
    case 0x239B: return (SDL12Key)0xab;
    case 0x239D: return (SDL12Key)0xac;
    case 0x239E: return (SDL12Key)0xad;
    case 0x23A0: return (SDL12Key)0xae;
    case 0x23A8: return (SDL12Key)0xaf;
    case 0x23AC: return (SDL12Key)0xb0;
    case 0x2264: return (SDL12Key)0xbc;
    case 0x2260: return (SDL12Key)0xbd;
    case 0x2265: return (SDL12Key)0xbe;
    case 0x222B: return (SDL12Key)0xbf;
    case 0x2234: return (SDL12Key)0xc0;
    case 0x221D: return (SDL12Key)0xc1;
    case 0x221E: return (SDL12Key)0xc2;
    case 0x2207: return (SDL12Key)0xc5;
    case 0x223C: return (SDL12Key)0xc8;
    case 0x2243: return (SDL12Key)0xc9;
    case 0x21D4: return (SDL12Key)0xcd;
    case 0x21D2: return (SDL12Key)0xce;
    case 0x2261: return (SDL12Key)0xcf;
    case 0x221A: return (SDL12Key)0xd6;
    case 0x2282: return (SDL12Key)0xda;
    case 0x2283: return (SDL12Key)0xdb;
    case 0x2229: return (SDL12Key)0xdc;
    case 0x222A: return (SDL12Key)0xdd;
    case 0x2227: return (SDL12Key)0xde;
    case 0x2228: return (SDL12Key)0xdf;
    case 0x2202: return (SDL12Key)0xef;
    case 0x0192: return (SDL12Key)0xf6;
    case 0x2190: return (SDL12Key)0xfb;
    case 0x2191: return (SDL12Key)0xfc;
    case 0x2192: return (SDL12Key)0xfd;
    case 0x2193: return (SDL12Key)0xfe;
    /* Publishing */
    case 0x2003: return (SDL12Key)0xa1;
    case 0x2002: return (SDL12Key)0xa2;
    case 0x2004: return (SDL12Key)0xa3;
    case 0x2005: return (SDL12Key)0xa4;
    case 0x2007: return (SDL12Key)0xa5;
    case 0x2008: return (SDL12Key)0xa6;
    case 0x2009: return (SDL12Key)0xa7;
    case 0x200A: return (SDL12Key)0xa8;
    case 0x2014: return (SDL12Key)0xa9;
    case 0x2013: return (SDL12Key)0xaa;
    case 0x2423: return (SDL12Key)0xac;
    case 0x2026: return (SDL12Key)0xae;
    case 0x2025: return (SDL12Key)0xaf;
    case 0x2153: return (SDL12Key)0xb0;
    case 0x2154: return (SDL12Key)0xb1;
    case 0x2155: return (SDL12Key)0xb2;
    case 0x2156: return (SDL12Key)0xb3;
    case 0x2157: return (SDL12Key)0xb4;
    case 0x2158: return (SDL12Key)0xb5;
    case 0x2159: return (SDL12Key)0xb6;
    case 0x215A: return (SDL12Key)0xb7;
    case 0x2105: return (SDL12Key)0xb8;
    case 0x2012: return (SDL12Key)0xbb;
    case 0x27E8: return (SDL12Key)0xbc;
    case 0x002E: return (SDL12Key)0xbd;
    case 0x27E9: return (SDL12Key)0xbe;
    case 0x215B: return (SDL12Key)0xc3;
    case 0x215C: return (SDL12Key)0xc4;
    case 0x215D: return (SDL12Key)0xc5;
    case 0x215E: return (SDL12Key)0xc6;
    case 0x2122: return (SDL12Key)0xc9;
    case 0x2613: return (SDL12Key)0xca;
    case 0x25C1: return (SDL12Key)0xcc;
    case 0x25B7: return (SDL12Key)0xcd;
    case 0x25CB: return (SDL12Key)0xce;
    case 0x25AF: return (SDL12Key)0xcf;
    case 0x2018: return (SDL12Key)0xd0;
    case 0x2019: return (SDL12Key)0xd1;
    case 0x201C: return (SDL12Key)0xd2;
    case 0x201D: return (SDL12Key)0xd3;
    case 0x211E: return (SDL12Key)0xd4;
    case 0x2030: return (SDL12Key)0xd5;
    case 0x2032: return (SDL12Key)0xd6;
    case 0x2033: return (SDL12Key)0xd7;
    case 0x271D: return (SDL12Key)0xd9;
    case 0x25AC: return (SDL12Key)0xdb;
    case 0x25C0: return (SDL12Key)0xdc;
    case 0x25B6: return (SDL12Key)0xdd;
    case 0x25CF: return (SDL12Key)0xde;
    case 0x25AE: return (SDL12Key)0xdf;
    case 0x25E6: return (SDL12Key)0xe0;
    case 0x25AB: return (SDL12Key)0xe1;
    case 0x25AD: return (SDL12Key)0xe2;
    case 0x25B3: return (SDL12Key)0xe3;
    case 0x25BD: return (SDL12Key)0xe4;
    case 0x2606: return (SDL12Key)0xe5;
    case 0x2022: return (SDL12Key)0xe6;
    case 0x25AA: return (SDL12Key)0xe7;
    case 0x25B2: return (SDL12Key)0xe8;
    case 0x25BC: return (SDL12Key)0xe9;
    case 0x261C: return (SDL12Key)0xea;
    case 0x261E: return (SDL12Key)0xeb;
    case 0x2663: return (SDL12Key)0xec;
    case 0x2666: return (SDL12Key)0xed;
    case 0x2665: return (SDL12Key)0xee;
    case 0x2720: return (SDL12Key)0xf0;
    case 0x2020: return (SDL12Key)0xf1;
    case 0x2021: return (SDL12Key)0xf2;
    case 0x2713: return (SDL12Key)0xf3;
    case 0x2717: return (SDL12Key)0xf4;
    case 0x266F: return (SDL12Key)0xf5;
    case 0x266D: return (SDL12Key)0xf6;
    case 0x2642: return (SDL12Key)0xf7;
    case 0x2640: return (SDL12Key)0xf8;
    case 0x260E: return (SDL12Key)0xf9;
    case 0x2315: return (SDL12Key)0xfa;
    case 0x2117: return (SDL12Key)0xfb;
    case 0x2038: return (SDL12Key)0xfc;
    case 0x201A: return (SDL12Key)0xfd;
    case 0x201E: return (SDL12Key)0xfe;
    /* Hebrew */
    case 0x2017: return (SDL12Key)0xdf;
    case 0x05D0: return (SDL12Key)0xe0;
    case 0x05D1: return (SDL12Key)0xe1;
    case 0x05D2: return (SDL12Key)0xe2;
    case 0x05D3: return (SDL12Key)0xe3;
    case 0x05D4: return (SDL12Key)0xe4;
    case 0x05D5: return (SDL12Key)0xe5;
    case 0x05D6: return (SDL12Key)0xe6;
    case 0x05D7: return (SDL12Key)0xe7;
    case 0x05D8: return (SDL12Key)0xe8;
    case 0x05D9: return (SDL12Key)0xe9;
    case 0x05DA: return (SDL12Key)0xea;
    case 0x05DB: return (SDL12Key)0xeb;
    case 0x05DC: return (SDL12Key)0xec;
    case 0x05DD: return (SDL12Key)0xed;
    case 0x05DE: return (SDL12Key)0xee;
    case 0x05DF: return (SDL12Key)0xef;
    case 0x05E0: return (SDL12Key)0xf0;
    case 0x05E1: return (SDL12Key)0xf1;
    case 0x05E2: return (SDL12Key)0xf2;
    case 0x05E3: return (SDL12Key)0xf3;
    case 0x05E4: return (SDL12Key)0xf4;
    case 0x05E5: return (SDL12Key)0xf5;
    case 0x05E6: return (SDL12Key)0xf6;
    case 0x05E7: return (SDL12Key)0xf7;
    case 0x05E8: return (SDL12Key)0xf8;
    case 0x05E9: return (SDL12Key)0xf9;
    case 0x05EA: return (SDL12Key)0xfa;
    /* Thai */
    case 0x0E01: return (SDL12Key)0xa1;
    case 0x0E02: return (SDL12Key)0xa2;
    case 0x0E03: return (SDL12Key)0xa3;
    case 0x0E04: return (SDL12Key)0xa4;
    case 0x0E05: return (SDL12Key)0xa5;
    case 0x0E06: return (SDL12Key)0xa6;
    case 0x0E07: return (SDL12Key)0xa7;
    case 0x0E08: return (SDL12Key)0xa8;
    case 0x0E09: return (SDL12Key)0xa9;
    case 0x0E0A: return (SDL12Key)0xaa;
    case 0x0E0B: return (SDL12Key)0xab;
    case 0x0E0C: return (SDL12Key)0xac;
    case 0x0E0D: return (SDL12Key)0xad;
    case 0x0E0E: return (SDL12Key)0xae;
    case 0x0E0F: return (SDL12Key)0xaf;
    case 0x0E10: return (SDL12Key)0xb0;
    case 0x0E11: return (SDL12Key)0xb1;
    case 0x0E12: return (SDL12Key)0xb2;
    case 0x0E13: return (SDL12Key)0xb3;
    case 0x0E14: return (SDL12Key)0xb4;
    case 0x0E15: return (SDL12Key)0xb5;
    case 0x0E16: return (SDL12Key)0xb6;
    case 0x0E17: return (SDL12Key)0xb7;
    case 0x0E18: return (SDL12Key)0xb8;
    case 0x0E19: return (SDL12Key)0xb9;
    case 0x0E1A: return (SDL12Key)0xba;
    case 0x0E1B: return (SDL12Key)0xbb;
    case 0x0E1C: return (SDL12Key)0xbc;
    case 0x0E1D: return (SDL12Key)0xbd;
    case 0x0E1E: return (SDL12Key)0xbe;
    case 0x0E1F: return (SDL12Key)0xbf;
    case 0x0E20: return (SDL12Key)0xc0;
    case 0x0E21: return (SDL12Key)0xc1;
    case 0x0E22: return (SDL12Key)0xc2;
    case 0x0E23: return (SDL12Key)0xc3;
    case 0x0E24: return (SDL12Key)0xc4;
    case 0x0E25: return (SDL12Key)0xc5;
    case 0x0E26: return (SDL12Key)0xc6;
    case 0x0E27: return (SDL12Key)0xc7;
    case 0x0E28: return (SDL12Key)0xc8;
    case 0x0E29: return (SDL12Key)0xc9;
    case 0x0E2A: return (SDL12Key)0xca;
    case 0x0E2B: return (SDL12Key)0xcb;
    case 0x0E2C: return (SDL12Key)0xcc;
    case 0x0E2D: return (SDL12Key)0xcd;
    case 0x0E2E: return (SDL12Key)0xce;
    case 0x0E2F: return (SDL12Key)0xcf;
    case 0x0E30: return (SDL12Key)0xd0;
    case 0x0E31: return (SDL12Key)0xd1;
    case 0x0E32: return (SDL12Key)0xd2;
    case 0x0E33: return (SDL12Key)0xd3;
    case 0x0E34: return (SDL12Key)0xd4;
    case 0x0E35: return (SDL12Key)0xd5;
    case 0x0E36: return (SDL12Key)0xd6;
    case 0x0E37: return (SDL12Key)0xd7;
    case 0x0E38: return (SDL12Key)0xd8;
    case 0x0E39: return (SDL12Key)0xd9;
    case 0x0E3A: return (SDL12Key)0xda;
    case 0x0E3F: return (SDL12Key)0xdf;
    case 0x0E40: return (SDL12Key)0xe0;
    case 0x0E41: return (SDL12Key)0xe1;
    case 0x0E42: return (SDL12Key)0xe2;
    case 0x0E43: return (SDL12Key)0xe3;
    case 0x0E44: return (SDL12Key)0xe4;
    case 0x0E45: return (SDL12Key)0xe5;
    case 0x0E46: return (SDL12Key)0xe6;
    case 0x0E47: return (SDL12Key)0xe7;
    case 0x0E48: return (SDL12Key)0xe8;
    case 0x0E49: return (SDL12Key)0xe9;
    case 0x0E4A: return (SDL12Key)0xea;
    case 0x0E4B: return (SDL12Key)0xeb;
    case 0x0E4C: return (SDL12Key)0xec;
    case 0x0E4D: return (SDL12Key)0xed;
    case 0x0E50: return (SDL12Key)0xf0;
    case 0x0E51: return (SDL12Key)0xf1;
    case 0x0E52: return (SDL12Key)0xf2;
    case 0x0E53: return (SDL12Key)0xf3;
    case 0x0E54: return (SDL12Key)0xf4;
    case 0x0E55: return (SDL12Key)0xf5;
    case 0x0E56: return (SDL12Key)0xf6;
    case 0x0E57: return (SDL12Key)0xf7;
    case 0x0E58: return (SDL12Key)0xf8;
    case 0x0E59: return (SDL12Key)0xf9;
    /* end of SDLK_WORLD_ keys based on Latin-* or similar High-ASCII charsets
     * and the low byte of their corresponding X11 XK_* KeySyms */
    default: break;
    }

    return SDLK12_UNKNOWN;
}